

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

bool __thiscall cppcms::xss::uri_parser::pct_encoded(uri_parser *this)

{
  char *pcVar1;
  uint uVar2;
  
  pcVar1 = this->begin_;
  if (((long)this->end_ - (long)pcVar1 < 3) || (*pcVar1 != '%')) {
    return false;
  }
  if (9 < (byte)(pcVar1[1] - 0x30U)) {
    uVar2 = (byte)pcVar1[1] - 0x41;
    if (0x25 < uVar2) {
      return false;
    }
    if ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      return false;
    }
  }
  if (9 < (byte)(pcVar1[2] - 0x30U)) {
    uVar2 = (byte)pcVar1[2] - 0x41;
    if (0x25 < uVar2) {
      return false;
    }
    if ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      return false;
    }
  }
  this->begin_ = pcVar1 + 3;
  return true;
}

Assistant:

bool pct_encoded()
		{
			if(end_ - begin_ >=3 && begin_[0]=='%' && is_hex(begin_[1]) && is_hex(begin_[2])) {
				begin_+=3;
				return true;
			}
			return false;
		}